

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::Solver(Solver *this)

{
  ClauseAllocator *this_00;
  int iVar1;
  FILE *pFVar2;
  char *__filename;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_00bbeec0;
  this->SolverType = 0;
  this->pCnfFunc = (_func_int_void_ptr_int_int_ptr *)0x0;
  this->nCallConfl = 1000;
  this->terminate_search_early = false;
  this->pstop = (int *)0x0;
  this->nRuntimeLimit = 0;
  (this->user_vec).data = (int *)0x0;
  (this->user_vec).sz = 0;
  (this->user_vec).cap = 0;
  (this->user_lits).data = (Lit *)0x0;
  (this->user_lits).sz = 0;
  (this->user_lits).cap = 0;
  (this->model).data = (lbool *)0x0;
  (this->model).sz = 0;
  (this->model).cap = 0;
  (this->conflict).data = (Lit *)0x0;
  (this->conflict).sz = 0;
  (this->conflict).cap = 0;
  this->verbosity = 0;
  this->verbEveryConflicts = 10000;
  this->showModel = 0;
  this->K = opt_K.value;
  this->R = opt_R.value;
  this->sizeLBDQueue = (double)opt_size_lbd_queue.value;
  this->sizeTrailQueue = (double)opt_size_trail_queue.value;
  this->firstReduceDB = opt_first_reduce_db.value;
  this->incReduceDB = opt_inc_reduce_db.value;
  this->specialIncReduceDB = opt_spec_inc_reduce_db.value;
  this->lbLBDFrozenClause = opt_lb_lbd_frozen_clause.value;
  this->lbSizeMinimizingClause = opt_lb_size_minimzing_clause.value;
  this->lbLBDMinimizingClause = opt_lb_lbd_minimzing_clause.value;
  this->var_decay = opt_var_decay.value;
  this->clause_decay = opt_clause_decay.value;
  this->random_var_freq = opt_random_var_freq.value;
  this->random_seed = opt_random_seed.value;
  this->ccmin_mode = opt_ccmin_mode.value;
  this->phase_saving = opt_phase_saving.value;
  this->rnd_pol = false;
  this->rnd_init_act = opt_rnd_init_act.value;
  this->garbage_frac = opt_garbage_frac.value;
  this->certifiedOutput = (FILE *)0x0;
  this->certifiedUNSAT = opt_certified_.value;
  memset(&this->nbRemovedClauses,0,0xa8);
  this->curRestart = 1;
  this->ok = true;
  this->cla_inc = 1.0;
  (this->activity).data = (double *)0x0;
  (this->activity).sz = 0;
  (this->activity).cap = 0;
  this->var_inc = 1.0;
  this_00 = &this->ca;
  (this->watches).occs.data = (vec<Gluco::Solver::Watcher> *)0x0;
  (this->watches).occs.sz = 0;
  (this->watches).occs.cap = 0;
  (this->watches).dirty.data = (char *)0x0;
  (this->watches).dirty.sz = 0;
  (this->watches).dirty.cap = 0;
  (this->watches).dirties.data = (Lit *)0x0;
  (this->watches).dirties.sz = 0;
  (this->watches).dirties.cap = 0;
  (this->watches).deleted.ca = this_00;
  (this->watchesBin).occs.data = (vec<Gluco::Solver::Watcher> *)0x0;
  (this->watchesBin).occs.sz = 0;
  (this->watchesBin).occs.cap = 0;
  (this->watchesBin).dirty.data = (char *)0x0;
  (this->watchesBin).dirty.sz = 0;
  (this->watchesBin).dirty.cap = 0;
  (this->watchesBin).dirties.data = (Lit *)0x0;
  (this->watchesBin).dirties.sz = 0;
  (this->watchesBin).dirties.cap = 0;
  (this->watchesBin).deleted.ca = this_00;
  memset(&this->clauses,0,0x94);
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  (this->assumptions).data = (Lit *)0x0;
  (this->assumptions).sz = 0;
  (this->assumptions).cap = 0;
  (this->order_heap).lt.activity = &this->activity;
  (this->order_heap).heap.data = (int *)0x0;
  (this->order_heap).heap.sz = 0;
  (this->order_heap).heap.cap = 0;
  (this->order_heap).indices.data = (int *)0x0;
  (this->order_heap).indices.sz = 0;
  (this->order_heap).indices.cap = 0;
  this->progress_estimate = 0.0;
  this->remove_satisfied = true;
  (this->permDiff).data = (uint *)0x0;
  (this->permDiff).sz = 0;
  (this->permDiff).cap = 0;
  (this->lastDecisionLevel).data = (Lit *)0x0;
  (this->lastDecisionLevel).sz = 0;
  (this->lastDecisionLevel).cap = 0;
  (this->ca).super_RegionAllocator<unsigned_int>.memory = (uint *)0x0;
  (this->ca).super_RegionAllocator<unsigned_int>.sz = 0;
  (this->ca).super_RegionAllocator<unsigned_int>.cap = 0;
  (this->ca).super_RegionAllocator<unsigned_int>.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity(&this_00->super_RegionAllocator<unsigned_int>,0x100000);
  (this->ca).super_RegionAllocator<unsigned_int>.field_0x14 = 0;
  (this->trailQueue).elems.data = (uint *)0x0;
  (this->trailQueue).elems.sz = 0;
  (this->trailQueue).elems.cap = 0;
  (this->trailQueue).first = 0;
  (this->trailQueue).last = 0;
  (this->trailQueue).sumofqueue = 0;
  *(undefined8 *)((long)&(this->trailQueue).sumofqueue + 1) = 0;
  *(undefined8 *)((long)&(this->trailQueue).maxsize + 1) = 0;
  (this->lbdQueue).elems.data = (uint *)0x0;
  (this->lbdQueue).elems.sz = 0;
  (this->lbdQueue).elems.cap = 0;
  (this->lbdQueue).first = 0;
  (this->lbdQueue).last = 0;
  (this->lbdQueue).sumofqueue = 0;
  *(undefined8 *)((long)&(this->lbdQueue).sumofqueue + 1) = 0;
  *(undefined8 *)((long)&(this->lbdQueue).maxsize + 1) = 0;
  (this->seen).data = (char *)0x0;
  (this->seen).sz = 0;
  (this->seen).cap = 0;
  (this->analyze_stack).data = (Lit *)0x0;
  (this->analyze_stack).sz = 0;
  (this->analyze_stack).cap = 0;
  (this->analyze_toclear).data = (Lit *)0x0;
  (this->analyze_toclear).sz = 0;
  (this->analyze_toclear).cap = 0;
  (this->add_tmp).data = (Lit *)0x0;
  (this->add_tmp).sz = 0;
  (this->add_tmp).cap = 0;
  *(undefined4 *)&this->conflict_budget = 0xffffffff;
  *(undefined4 *)((long)&this->conflict_budget + 4) = 0xffffffff;
  *(undefined4 *)&this->propagation_budget = 0xffffffff;
  *(undefined4 *)((long)&this->propagation_budget + 4) = 0xffffffff;
  this->asynch_interrupt = false;
  this->incremental = (uint)opt_incremental.value;
  this->nbVarsInitialFormula = 0x7fffffff;
  this->MYFLAG = 0;
  (this->assumptionPositions).data = (int *)0x0;
  (this->assumptionPositions).sz = 0;
  (this->assumptionPositions).cap = 0;
  (this->initialPositions).data = (int *)0x0;
  (this->initialPositions).sz = 0;
  (this->initialPositions).cap = 0;
  bqueue<unsigned_int>::initSize(&this->lbdQueue,(int)this->sizeLBDQueue);
  bqueue<unsigned_int>::initSize(&this->trailQueue,(int)this->sizeTrailQueue);
  this->sumLBD = 0.0;
  this->nbclausesbeforereduce = this->firstReduceDB;
  this->totalTime4Sat = 0.0;
  this->totalTime4Unsat = 0.0;
  this->nbSatCalls = 0;
  __filename = opt_certified_file_.value;
  this->nbUnsatCalls = 0;
  if (this->certifiedUNSAT == true) {
    iVar1 = strcmp(opt_certified_file_.value,"NULL");
    if (iVar1 == 0) {
      __filename = "/dev/stdout";
    }
    pFVar2 = fopen(__filename,"wb");
    this->certifiedOutput = (FILE *)pFVar2;
  }
  return;
}

Assistant:

Solver::Solver() :

    // Parameters (user settable):
    //
    SolverType(0)
    , pCnfFunc(NULL)
    , nCallConfl(1000)
    , terminate_search_early(false)
    , pstop(NULL)
    , nRuntimeLimit(0)

    , verbosity      (0)
    , verbEveryConflicts(10000)
    , showModel      (0)
    , K              (opt_K)
    , R              (opt_R)
    , sizeLBDQueue   (opt_size_lbd_queue)
    , sizeTrailQueue   (opt_size_trail_queue)
    , firstReduceDB  (opt_first_reduce_db)
    , incReduceDB    (opt_inc_reduce_db)
    , specialIncReduceDB    (opt_spec_inc_reduce_db)
    , lbLBDFrozenClause (opt_lb_lbd_frozen_clause)
    , lbSizeMinimizingClause (opt_lb_size_minimzing_clause)
    , lbLBDMinimizingClause (opt_lb_lbd_minimzing_clause)
  , var_decay        (opt_var_decay)
  , clause_decay     (opt_clause_decay)
  , random_var_freq  (opt_random_var_freq)
  , random_seed      (opt_random_seed)
  , ccmin_mode       (opt_ccmin_mode)
  , phase_saving     (opt_phase_saving)
  , rnd_pol          (false)
  , rnd_init_act     (opt_rnd_init_act)
  , garbage_frac     (opt_garbage_frac)
  , certifiedOutput  (NULL)
  , certifiedUNSAT   (opt_certified_) 
    // Statistics: (formerly in 'SolverStats')
    //
  ,  nbRemovedClauses(0),nbReducedClauses(0), nbDL2(0),nbBin(0),nbUn(0) , nbReduceDB(0)
    , solves(0), starts(0), decisions(0), rnd_decisions(0), propagations(0),conflicts(0),conflictsRestarts(0),nbstopsrestarts(0),nbstopsrestartssame(0),lastblockatrestart(0)
  , dec_vars(0), clauses_literals(0), learnts_literals(0), max_literals(0), tot_literals(0)
    , curRestart(1)

  , ok                 (true)
  , cla_inc            (1)
  , var_inc            (1)
  , watches            (WatcherDeleted(ca))
  , watchesBin            (WatcherDeleted(ca))
  , qhead              (0)
  , simpDB_assigns     (-1)
  , simpDB_props       (0)
  , order_heap         (VarOrderLt(activity))
  , progress_estimate  (0)
  , remove_satisfied   (true)

    // Resource constraints:
    //
  , conflict_budget    (-1)
  , propagation_budget (-1)
  , asynch_interrupt   (false)
  , incremental(opt_incremental)
  , nbVarsInitialFormula(INT32_MAX)
{
  MYFLAG=0;  
  // Initialize only first time. Useful for incremental solving, useless otherwise
  lbdQueue.initSize(sizeLBDQueue);
  trailQueue.initSize(sizeTrailQueue);
  sumLBD = 0;
  nbclausesbeforereduce = firstReduceDB;
  totalTime4Sat=0;totalTime4Unsat=0;
  nbSatCalls=0;nbUnsatCalls=0;


  if(certifiedUNSAT) {
    if(!strcmp(opt_certified_file_,"NULL")) {
      certifiedOutput =  fopen("/dev/stdout", "wb");
    } else {
      certifiedOutput =  fopen(opt_certified_file_, "wb");           
    }
    //    fprintf(certifiedOutput,"o proof DRUP\n");
  }
}